

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

xxh_u8 * XXH3_consumeStripes(xxh_u64 *acc,size_t *nbStripesSoFarPtr,size_t nbStripesPerBlock,
                            xxh_u8 *input,size_t nbStripes,xxh_u8 *secret,size_t secretLimit,
                            XXH3_f_accumulate f_acc,XXH3_f_scrambleAcc f_scramble)

{
  xxh_u8 *in_RCX;
  ulong in_RDX;
  long *in_RSI;
  undefined8 in_RDI;
  ulong in_R8;
  long in_R9;
  size_t nbStripesThisIter;
  xxh_u8 *initialSecret;
  ulong local_40;
  long local_38;
  ulong local_28;
  xxh_u8 *local_20;
  
  local_38 = in_R9 + *in_RSI * 8;
  local_28 = in_R8;
  local_20 = in_RCX;
  if (in_RDX - *in_RSI <= in_R8) {
    local_40 = in_RDX - *in_RSI;
    do {
      (*(code *)initialSecret)(in_RDI,local_20,local_38,local_40);
      (*(code *)secret)(in_RDI,in_R9 + nbStripesThisIter);
      local_20 = local_20 + local_40 * 0x40;
      local_28 = local_28 - local_40;
      local_40 = in_RDX;
      local_38 = in_R9;
    } while (in_RDX <= local_28);
    *in_RSI = 0;
  }
  if (local_28 != 0) {
    (*(code *)initialSecret)(in_RDI,local_20,local_38,local_28);
    local_20 = local_20 + local_28 * 0x40;
    *in_RSI = local_28 + *in_RSI;
  }
  return local_20;
}

Assistant:

XXH_FORCE_INLINE const xxh_u8 *
XXH3_consumeStripes(xxh_u64* XXH_RESTRICT acc,
                    size_t* XXH_RESTRICT nbStripesSoFarPtr, size_t nbStripesPerBlock,
                    const xxh_u8* XXH_RESTRICT input, size_t nbStripes,
                    const xxh_u8* XXH_RESTRICT secret, size_t secretLimit,
                    XXH3_f_accumulate f_acc,
                    XXH3_f_scrambleAcc f_scramble)
{
    const xxh_u8* initialSecret = secret + *nbStripesSoFarPtr * XXH_SECRET_CONSUME_RATE;
    /* Process full blocks */
    if (nbStripes >= (nbStripesPerBlock - *nbStripesSoFarPtr)) {
        /* Process the initial partial block... */
        size_t nbStripesThisIter = nbStripesPerBlock - *nbStripesSoFarPtr;

        do {
            /* Accumulate and scramble */
            f_acc(acc, input, initialSecret, nbStripesThisIter);
            f_scramble(acc, secret + secretLimit);
            input += nbStripesThisIter * XXH_STRIPE_LEN;
            nbStripes -= nbStripesThisIter;
            /* Then continue the loop with the full block size */
            nbStripesThisIter = nbStripesPerBlock;
            initialSecret = secret;
        } while (nbStripes >= nbStripesPerBlock);
        *nbStripesSoFarPtr = 0;
    }
    /* Process a partial block */
    if (nbStripes > 0) {
        f_acc(acc, input, initialSecret, nbStripes);
        input += nbStripes * XXH_STRIPE_LEN;
        *nbStripesSoFarPtr += nbStripes;
    }
    /* Return end pointer */
    return input;
}